

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

void testutil_random_ge_jacobian_test(secp256k1_gej *gej,secp256k1_ge *ge)

{
  long in_RSI;
  long in_RDI;
  secp256k1_fe z3;
  secp256k1_fe z2;
  secp256k1_fe *in_stack_ffffffffffffff88;
  secp256k1_fe *in_stack_ffffffffffffff90;
  
  testutil_random_fe_non_zero_test((secp256k1_fe *)0x14959c);
  secp256k1_fe_sqr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  secp256k1_fe_mul(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(secp256k1_fe *)0x1495c7);
  secp256k1_fe_mul(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(secp256k1_fe *)0x1495db);
  secp256k1_fe_mul(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(secp256k1_fe *)0x1495f7);
  *(undefined4 *)(in_RDI + 0x90) = *(undefined4 *)(in_RSI + 0x60);
  return;
}

Assistant:

static void testutil_random_ge_jacobian_test(secp256k1_gej *gej, const secp256k1_ge *ge) {
    secp256k1_fe z2, z3;
    testutil_random_fe_non_zero_test(&gej->z);
    secp256k1_fe_sqr(&z2, &gej->z);
    secp256k1_fe_mul(&z3, &z2, &gej->z);
    secp256k1_fe_mul(&gej->x, &ge->x, &z2);
    secp256k1_fe_mul(&gej->y, &ge->y, &z3);
    gej->infinity = ge->infinity;
}